

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_pole(obj *obj)

{
  boolean bVar1;
  byte bVar2;
  int iVar3;
  monst *local_50;
  monst *local_48;
  int oldhp;
  monst *mtmp;
  int local_28;
  int iStack_24;
  coord cc;
  int min_range;
  int max_range;
  int typ;
  int res;
  obj *obj_local;
  
  max_range = 0;
  iStack_24 = 4;
  local_28 = 4;
  if ((u._1052_1_ & 1) != 0) {
    pline("There\'s not enough room here to use that.");
    return 0;
  }
  if (obj != uwep) {
    bVar1 = wield_tool(obj,"swing");
    if (bVar1 == '\0') {
      return 0;
    }
    max_range = 1;
  }
  pline("Where do you want to hit?");
  mtmp._6_2_ = (coord)CONCAT11(u.uy,u.ux);
  iVar3 = getpos((coord *)((long)&mtmp + 6),'\0',"the spot to hit");
  if (iVar3 < 0) {
    return 0;
  }
  iVar3 = uwep_skill_type();
  if ((iVar3 == 0) || (u.weapon_skills[iVar3].skill < '\x03')) {
    iStack_24 = 4;
  }
  else if (u.weapon_skills[iVar3].skill == '\x03') {
    iStack_24 = 5;
  }
  else {
    iStack_24 = 8;
  }
  iVar3 = dist2((int)mtmp._6_1_,(int)mtmp._7_1_,(int)u.ux,(int)u.uy);
  if (iStack_24 < iVar3) {
    pline("Too far!");
    return max_range;
  }
  iVar3 = dist2((int)mtmp._6_1_,(int)mtmp._7_1_,(int)u.ux,(int)u.uy);
  if (iVar3 < local_28) {
    pline("Too close!");
    return max_range;
  }
  if ((viz_array[mtmp._7_1_][mtmp._6_1_] & 2U) == 0) {
    if ((level->monsters[mtmp._6_1_][mtmp._7_1_] == (monst *)0x0) ||
       ((*(uint *)&level->monsters[mtmp._6_1_][mtmp._7_1_]->field_0x60 >> 9 & 1) != 0)) {
      local_48 = (monst *)0x0;
    }
    else {
      local_48 = level->monsters[mtmp._6_1_][mtmp._7_1_];
    }
    if (local_48 != (monst *)0x0) {
      if (local_48->wormno == '\0') {
        if ((viz_array[local_48->my][local_48->mx] & 2U) == 0) {
          if ((((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
              ((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')))) ||
             (((u.uprops[0x40].intrinsic == 0 &&
               ((u.uprops[0x40].extrinsic == 0 && (((youmonst.data)->mflags3 & 0x100) == 0)))) ||
              ((local_48->data->mflags3 & 0x200) == 0)))) goto LAB_00153764;
          bVar2 = viz_array[local_48->my][local_48->mx] & 1;
          goto joined_r0x001536d5;
        }
      }
      else {
        bVar2 = worm_known(level,local_48);
joined_r0x001536d5:
        if (bVar2 == 0) goto LAB_00153764;
      }
      if ((((((*(uint *)&local_48->field_0x60 >> 1 & 1) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) || (((youmonst.data)->mflags1 & 0x1000000) != 0)) &&
         ((((*(uint *)&local_48->field_0x60 >> 7 & 1) == 0 &&
           ((*(uint *)&local_48->field_0x60 >> 9 & 1) == 0)) && (((byte)u._1052_1_ >> 5 & 1) == 0)))
         ) goto LAB_0015377d;
    }
LAB_00153764:
    pline("You won\'t hit anything if you can\'t see that spot.");
    obj_local._4_4_ = max_range;
  }
  else {
LAB_0015377d:
    if ((viz_array[mtmp._7_1_][mtmp._6_1_] & 1U) == 0) {
      pline("You can\'t reach that spot from here.");
      obj_local._4_4_ = max_range;
    }
    else {
      if ((level->monsters[mtmp._6_1_][mtmp._7_1_] == (monst *)0x0) ||
         ((*(uint *)&level->monsters[mtmp._6_1_][mtmp._7_1_]->field_0x60 >> 9 & 1) != 0)) {
        local_50 = (monst *)0x0;
      }
      else {
        local_50 = level->monsters[mtmp._6_1_][mtmp._7_1_];
      }
      if (local_50 == (monst *)0x0) {
        pline("Nothing happens.");
      }
      else {
        iVar3 = local_50->mhp;
        bhitpos = mtmp._6_2_;
        check_caitiff(local_50);
        thitmonst(local_50,uwep,(obj *)0x0);
        if (local_50->mhp < iVar3) {
          u.uconduct.weaphit = u.uconduct.weaphit + 1;
        }
      }
      obj_local._4_4_ = 1;
    }
  }
  return obj_local._4_4_;
}

Assistant:

static int use_pole (struct obj *obj)
{
	int res = 0, typ, max_range = 4, min_range = 4;
	coord cc;
	struct monst *mtmp;


	/* Are you allowed to use the pole? */
	if (u.uswallow) {
	    pline(not_enough_room);
	    return 0;
	}
	if (obj != uwep) {
	    if (!wield_tool(obj, "swing")) return 0;
	    else res = 1;
	}
     /* assert(obj == uwep); */

	/* Prompt for a location */
	pline(where_to_hit);
	cc.x = u.ux;
	cc.y = u.uy;
	if (getpos(&cc, FALSE, "the spot to hit") < 0)
	    return 0;	/* user pressed ESC */

	/* Calculate range */
	typ = uwep_skill_type();
	if (typ == P_NONE || P_SKILL(typ) <= P_BASIC) max_range = 4;
	else if (P_SKILL(typ) == P_SKILLED) max_range = 5;
	else max_range = 8;
	if (distu(cc.x, cc.y) > max_range) {
	    pline("Too far!");
	    return res;
	} else if (distu(cc.x, cc.y) < min_range) {
	    pline("Too close!");
	    return res;
	} else if (!cansee(cc.x, cc.y) &&
		   ((mtmp = m_at(level, cc.x, cc.y)) == NULL ||
		    !canseemon(level, mtmp))) {
	    pline(cant_see_spot);
	    return res;
	} else if (!couldsee(cc.x, cc.y)) { /* Eyes of the Overworld */
	    pline(cant_reach);
	    return res;
	}

	/* Attack the monster there */
	if ((mtmp = m_at(level, cc.x, cc.y)) != NULL) {
	    int oldhp = mtmp->mhp;

	    bhitpos = cc;
	    check_caitiff(mtmp);
	    thitmonst(mtmp, uwep, NULL);
	    /* check the monster's HP because thitmonst() doesn't return
	     * an indication of whether it hit.  Not perfect (what if it's a
	     * non-silver weapon on a shade?)
	     */
	    if (mtmp->mhp < oldhp)
		u.uconduct.weaphit++;
	} else
	    /* Now you know that nothing is there... */
	    pline("Nothing happens.");
	return 1;
}